

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O1

void __thiscall
qclab::qgates::QRotationGate1<std::complex<double>_>::QRotationGate1
          (QRotationGate1<std::complex<double>_> *this,int qubit,real_type theta,bool fixed)

{
  double dVar1;
  
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0051ff08;
  (this->super_QGate1<std::complex<double>_>).qubit_ = qubit;
  if (-1 < qubit) {
    (this->super_QGate1<std::complex<double>_>).field_0xc = fixed;
    (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_00521670;
    dVar1 = ::cos(theta * 0.5);
    (this->rotation_).angle_.cos_ = dVar1;
    dVar1 = ::sin(theta * 0.5);
    (this->rotation_).angle_.sin_ = dVar1;
    return;
  }
  __assert_fail("qubit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                ,0x21,
                "qclab::qgates::QGate1<std::complex<double>>::QGate1(const int) [T = std::complex<double>]"
               );
}

Assistant:

QRotationGate1()
        : QGate1< T >( 0 )
        , rotation_()
        , QAdjustable()
        { }